

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalUnixMakefileGenerator3.cxx
# Opt level: O3

void cmGlobalUnixMakefileGenerator3::GetDocumentation(cmDocumentationEntry *entry)

{
  undefined6 *local_38;
  undefined8 local_30;
  undefined6 local_28;
  undefined2 uStack_22;
  undefined6 uStack_20;
  undefined1 local_1a;
  
  local_28 = 0x4d2078696e55;
  uStack_22 = 0x6b61;
  uStack_20 = 0x73656c696665;
  local_30 = 0xe;
  local_1a = 0;
  local_38 = &local_28;
  std::__cxx11::string::operator=((string *)entry,(string *)&local_38);
  if (local_38 != &local_28) {
    operator_delete(local_38,CONCAT26(uStack_22,local_28) + 1);
  }
  std::__cxx11::string::_M_replace
            ((ulong)&entry->Brief,0,(char *)(entry->Brief)._M_string_length,0x6ac8fd);
  return;
}

Assistant:

void cmGlobalUnixMakefileGenerator3::GetDocumentation(
  cmDocumentationEntry& entry)
{
  entry.Name = cmGlobalUnixMakefileGenerator3::GetActualName();
  entry.Brief = "Generates standard UNIX makefiles.";
}